

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O0

void StateGetMoveHistory(pyhanabi_state_t *state,int index,pyhanabi_history_item_t *item)

{
  HanabiMove *pHVar1;
  const_reference pvVar2;
  undefined8 *in_RDX;
  long *in_RDI;
  size_type in_stack_ffffffffffffffb8;
  vector<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>
  *in_stack_ffffffffffffffc0;
  
  if (in_RDI == (long *)0x0) {
    __assert_fail("state != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                  ,0x1eb,
                  "void StateGetMoveHistory(pyhanabi_state_t *, int, pyhanabi_history_item_t *)");
  }
  if (*in_RDI != 0) {
    if (in_RDX != (undefined8 *)0x0) {
      pHVar1 = (HanabiMove *)operator_new(0x10);
      hanabi_learning_env::HanabiState::MoveHistory((HanabiState *)*in_RDI);
      pvVar2 = std::
               vector<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>
               ::at(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      *pHVar1 = pvVar2->move;
      pHVar1[1] = *(HanabiMove *)&pvVar2->player;
      *in_RDX = pHVar1;
      return;
    }
    __assert_fail("item != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                  ,0x1ed,
                  "void StateGetMoveHistory(pyhanabi_state_t *, int, pyhanabi_history_item_t *)");
  }
  __assert_fail("state->state != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                ,0x1ec,
                "void StateGetMoveHistory(pyhanabi_state_t *, int, pyhanabi_history_item_t *)");
}

Assistant:

void StateGetMoveHistory(pyhanabi_state_t* state, int index,
                         pyhanabi_history_item_t* item) {
  REQUIRE(state != nullptr);
  REQUIRE(state->state != nullptr);
  REQUIRE(item != nullptr);
  item->item = new hanabi_learning_env::HanabiHistoryItem(
      reinterpret_cast<const hanabi_learning_env::HanabiState*>(state->state)
          ->MoveHistory()
          .at(index));
}